

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3BeginTransaction(Parse *pParse,int type)

{
  sqlite3 *psVar1;
  Btree *p;
  int iVar2;
  Vdbe *p_00;
  Btree *pBt;
  int eTxnType;
  int i;
  Vdbe *v;
  sqlite3 *db;
  int type_local;
  Parse *pParse_local;
  
  psVar1 = pParse->db;
  iVar2 = sqlite3AuthCheck(pParse,0x16,"BEGIN",(char *)0x0,(char *)0x0);
  if ((iVar2 == 0) && (p_00 = sqlite3GetVdbe(pParse), p_00 != (Vdbe *)0x0)) {
    if (type != 7) {
      for (pBt._4_4_ = 0; pBt._4_4_ < psVar1->nDb; pBt._4_4_ = pBt._4_4_ + 1) {
        p = psVar1->aDb[pBt._4_4_].pBt;
        if ((p == (Btree *)0x0) || (iVar2 = sqlite3BtreeIsReadonly(p), iVar2 == 0)) {
          if (type == 9) {
            pBt._0_4_ = 2;
          }
          else {
            pBt._0_4_ = 1;
          }
        }
        else {
          pBt._0_4_ = 0;
        }
        sqlite3VdbeAddOp2(p_00,2,pBt._4_4_,(int)pBt);
        sqlite3VdbeUsesBtree(p_00,pBt._4_4_);
      }
    }
    sqlite3VdbeAddOp0(p_00,1);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BeginTransaction(Parse *pParse, int type){
  sqlite3 *db;
  Vdbe *v;
  int i;

  assert( pParse!=0 );
  db = pParse->db;
  assert( db!=0 );
  if( sqlite3AuthCheck(pParse, SQLITE_TRANSACTION, "BEGIN", 0, 0) ){
    return;
  }
  v = sqlite3GetVdbe(pParse);
  if( !v ) return;
  if( type!=TK_DEFERRED ){
    for(i=0; i<db->nDb; i++){
      int eTxnType;
      Btree *pBt = db->aDb[i].pBt;
      if( pBt && sqlite3BtreeIsReadonly(pBt) ){
        eTxnType = 0;  /* Read txn */
      }else if( type==TK_EXCLUSIVE ){
        eTxnType = 2;  /* Exclusive txn */
      }else{
        eTxnType = 1;  /* Write txn */
      }
      sqlite3VdbeAddOp2(v, OP_Transaction, i, eTxnType);
      sqlite3VdbeUsesBtree(v, i);
    }
  }
  sqlite3VdbeAddOp0(v, OP_AutoCommit);
}